

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O0

void shiftConstraints(QList<QSimplexConstraint_*> *constraints,qreal amount)

{
  QSimplexConstraint *pQVar1;
  const_iterator __first;
  QList<QSimplexConstraint_*> *this;
  qsizetype qVar2;
  const_reference ppQVar3;
  QList<QSimplexConstraint_*> *in_RDI;
  double in_XMM0_Qa;
  const_iterator cVar4;
  const_iterator cVar5;
  qreal multiplier;
  QSimplexConstraint *c;
  int i;
  qsizetype in_stack_ffffffffffffffa8;
  Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *in_stack_ffffffffffffffb8;
  Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *in_stack_ffffffffffffffc8;
  Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *pDVar6;
  double in_stack_ffffffffffffffd8;
  int local_14;
  
  local_14 = 0;
  while( true ) {
    this = (QList<QSimplexConstraint_*> *)(long)local_14;
    qVar2 = QList<QSimplexConstraint_*>::size(in_RDI);
    if (qVar2 <= (long)this) break;
    ppQVar3 = QList<QSimplexConstraint_*>::at(this,in_stack_ffffffffffffffa8);
    pQVar1 = *ppQVar3;
    cVar4 = QHash<QSimplexVariable_*,_double>::cbegin
                      ((QHash<QSimplexVariable_*,_double> *)in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffffc8 = cVar4.i.d;
    pDVar6 = (Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *)cVar4.i.bucket;
    cVar5 = QHash<QSimplexVariable_*,_double>::cend
                      ((QHash<QSimplexVariable_*,_double> *)in_stack_ffffffffffffffb8);
    in_stack_ffffffffffffffb8 = cVar5.i.d;
    __first.i.bucket = (size_t)in_stack_ffffffffffffffd8;
    __first.i.d = pDVar6;
    cVar4.i.bucket = (size_t)in_stack_ffffffffffffffc8;
    cVar4.i.d = (Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *)cVar5.i.bucket;
    in_stack_ffffffffffffffd8 =
         std::accumulate<QHash<QSimplexVariable*,double>::const_iterator,double>
                   (__first,cVar4,(double)in_stack_ffffffffffffffb8);
    pQVar1->constant = in_stack_ffffffffffffffd8 * in_XMM0_Qa + pQVar1->constant;
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

static void shiftConstraints(const QList<QSimplexConstraint *> &constraints, qreal amount)
{
    for (int i = 0; i < constraints.size(); ++i) {
        QSimplexConstraint *c = constraints.at(i);
        const qreal multiplier = std::accumulate(c->variables.cbegin(), c->variables.cend(), qreal(0));
        c->constant += multiplier * amount;
    }
}